

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.c
# Opt level: O3

int getstring(int *ip,char *buffer,int size)

{
  ushort *puVar1;
  ushort **ppuVar2;
  int iVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  
  ppuVar2 = __ctype_b_loc();
  puVar1 = *ppuVar2;
  uVar4 = (ulong)*ip;
  pcVar7 = prlnbuf + uVar4;
  cVar5 = prlnbuf[uVar4];
  while (iVar3 = (int)uVar4, (*(byte *)((long)puVar1 + (long)cVar5 * 2 + 1) & 0x20) != 0) {
    uVar4 = (ulong)(iVar3 + 1U);
    *ip = iVar3 + 1U;
    cVar5 = pcVar7[1];
    pcVar7 = pcVar7 + 1;
  }
  *ip = iVar3 + 1;
  if (*pcVar7 == '\"') {
    *ip = iVar3 + 2;
    cVar5 = prlnbuf[(long)iVar3 + 1];
    uVar4 = 0;
    if (cVar5 != '\"') {
      if (size < 1) {
        size = 0;
      }
      pcVar7 = "String too long!";
      do {
        if ((uint)size == uVar4) goto LAB_00109eec;
        buffer[uVar4] = cVar5;
        uVar4 = uVar4 + 1;
        iVar3 = *ip;
        *ip = iVar3 + 1;
        cVar5 = prlnbuf[iVar3];
      } while (cVar5 != '\"');
    }
    buffer[uVar4] = '\0';
    puVar1 = *ppuVar2;
    iVar6 = *ip;
    iVar3 = 1;
    if ((*(byte *)((long)puVar1 + (long)prlnbuf[iVar6] * 2 + 1) & 0x20) != 0) {
      pcVar7 = prlnbuf + (long)iVar6 + 1;
      do {
        iVar6 = iVar6 + 1;
        *ip = iVar6;
        cVar5 = *pcVar7;
        pcVar7 = pcVar7 + 1;
      } while ((*(byte *)((long)puVar1 + (long)cVar5 * 2 + 1) & 0x20) != 0);
    }
  }
  else {
    pcVar7 = "Incorrect string syntax!";
LAB_00109eec:
    error(pcVar7);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
getstring(int *ip, char *buffer, int size)
{
	char c;
	int i;

	/* skip spaces */
	while (isspace(prlnbuf[*ip]))
		(*ip)++;

	/* string must be enclosed */
	if (prlnbuf[(*ip)++] != '\"') {
		error("Incorrect string syntax!");
		return (0);
	}

	/* get string */
	i = 0;
	for (;;) {
		c = prlnbuf[(*ip)++];
		if (c == '\"')
			break;
		if (i >= size) {
			error("String too long!");
			return (0);
		}
		buffer[i++] = c;
	}

	/* end the string */
	buffer[i] = '\0';

	/* skip spaces */
	while (isspace(prlnbuf[*ip]))
		(*ip)++;

	/* ok */
	return (1);
}